

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

bool __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
::EqualElement<char[12]>::operator()
          (EqualElement<char[12]> *this,basic_string_view<char,_std::char_traits<char>_> *lhs,
          piecewise_construct_t *param_2,
          tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *param_3,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *param_4)

{
  StringEq *this_00;
  string_view lhs_00;
  bool bVar1;
  string_view local_50;
  size_t local_40;
  char *local_38;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *local_30;
  tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *param_4_local;
  tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *param_3_local;
  piecewise_construct_t *param_2_local;
  basic_string_view<char,_std::char_traits<char>_> *lhs_local;
  EqualElement<char[12]> *this_local;
  
  this_00 = *(StringEq **)(this + 8);
  local_40 = lhs->_M_len;
  local_38 = lhs->_M_str;
  local_30 = param_4;
  param_4_local =
       (tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        *)param_3;
  param_3_local = (tuple<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)param_2;
  param_2_local = (piecewise_construct_t *)lhs;
  lhs_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,*(char **)this)
  ;
  lhs_00._M_str = local_38;
  lhs_00._M_len = local_40;
  bVar1 = StringEq::operator()(this_00,lhs_00,local_50);
  return bVar1;
}

Assistant:

bool operator()(const K2& lhs, Args&&...) const {
      return eq(lhs, rhs);
    }